

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_rec rf_get_collision_rec(rf_rec rec1,rf_rec rec2)

{
  float fVar1;
  float fVar2;
  float fVar4;
  undefined8 uVar3;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  rf_rec rVar12;
  
  fVar2 = rec1.x;
  fVar4 = rec1.y;
  fVar1 = rec2.x;
  fVar7 = rec2.y;
  fVar8 = rec2.width;
  uVar3 = 0;
  if (fVar2 < fVar1 + fVar8) {
    fVar5 = rec1.width;
    if ((fVar1 < fVar2 + fVar5) && (fVar9 = rec2.height, fVar4 < fVar7 + fVar9)) {
      fVar6 = rec1.height;
      fVar10 = 0.0;
      fVar11 = 0.0;
      if (fVar7 < fVar4 + fVar6) {
        fVar11 = fVar9;
        if (fVar2 <= fVar1) {
          fVar10 = fVar5;
          if (fVar4 <= fVar7) {
            uVar3 = rec2._0_8_;
            fVar11 = fVar6;
          }
          else {
            uVar3 = CONCAT44(fVar4,fVar1);
          }
        }
        else {
          fVar10 = fVar8;
          if (fVar4 <= fVar7) {
            uVar3 = CONCAT44(fVar7,fVar2);
            fVar11 = fVar6;
          }
          else {
            uVar3 = rec1._0_8_;
          }
        }
        fVar10 = fVar10 - ABS(fVar2 - fVar1);
        fVar11 = fVar11 - ABS(fVar4 - fVar7);
        if (fVar5 <= fVar8) {
          if (fVar5 <= fVar10) {
            fVar10 = fVar5;
          }
        }
        else if (fVar8 <= fVar10) {
          fVar10 = fVar8;
        }
        if (fVar6 <= fVar9) {
          if (fVar6 <= fVar11) {
            fVar11 = fVar6;
          }
        }
        else if (fVar9 <= fVar11) {
          fVar11 = fVar9;
        }
      }
      goto LAB_00123432;
    }
  }
  fVar10 = 0.0;
  fVar11 = 0.0;
LAB_00123432:
  rVar12.height = fVar11;
  rVar12.width = fVar10;
  rVar12.x = (float)(int)uVar3;
  rVar12.y = (float)(int)((ulong)uVar3 >> 0x20);
  return rVar12;
}

Assistant:

rf_rec rf_get_collision_rec(rf_rec rec1, rf_rec rec2)
{
    rf_rec retRec = {0, 0, 0, 0};

    if (rf_check_collision_recs(rec1, rec2))
    {
        float dxx = (float) fabs(rec1.x - rec2.x);
        float dyy = (float) fabs(rec1.y - rec2.y);

        if (rec1.x <= rec2.x)
        {
            if (rec1.y <= rec2.y)
            {
                retRec.x = rec2.x;
                retRec.y = rec2.y;
                retRec.width = rec1.width - dxx;
                retRec.height = rec1.height - dyy;
            } else
            {
                retRec.x = rec2.x;
                retRec.y = rec1.y;
                retRec.width = rec1.width - dxx;
                retRec.height = rec2.height - dyy;
            }
        } else
        {
            if (rec1.y <= rec2.y)
            {
                retRec.x = rec1.x;
                retRec.y = rec2.y;
                retRec.width = rec2.width - dxx;
                retRec.height = rec1.height - dyy;
            } else
            {
                retRec.x = rec1.x;
                retRec.y = rec1.y;
                retRec.width = rec2.width - dxx;
                retRec.height = rec2.height - dyy;
            }
        }

        if (rec1.width > rec2.width)
        {
            if (retRec.width >= rec2.width) retRec.width = rec2.width;
        } else
        {
            if (retRec.width >= rec1.width) retRec.width = rec1.width;
        }

        if (rec1.height > rec2.height)
        {
            if (retRec.height >= rec2.height) retRec.height = rec2.height;
        } else
        {
            if (retRec.height >= rec1.height) retRec.height = rec1.height;
        }
    }

    return retRec;
}